

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrunner.cpp
# Opt level: O0

void __thiscall trun::TestRunner::PrepareTests(TestRunner *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *symbol;
  shared_ptr<trun::IDynLibrary> *this_00;
  Log *pLVar1;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  char *pcVar5;
  Version *this_01;
  char *pcVar6;
  undefined4 extraout_var_00;
  reference __str;
  element_type *peVar7;
  string *psVar8;
  char *arguments_3;
  element_type *peVar9;
  undefined1 local_e0 [16];
  undefined1 local_d0 [8];
  Ref tModule;
  string moduleName;
  undefined1 local_88 [8];
  Ref func;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> x;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_30;
  TestRunner *local_10;
  TestRunner *this_local;
  
  pLVar1 = this->pLogger;
  local_10 = this;
  peVar4 = std::__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->library);
  iVar3 = (*peVar4->_vptr_IDynLibrary[6])();
  pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(extraout_var,iVar3));
  peVar4 = std::__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->library);
  this_01 = IDynLibrary::GetVersion(peVar4);
  Version::AsString_abi_cxx11_(&local_30,this_01);
  pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (&local_30);
  gnilk::Log::Info<char_const*,char_const*,char_const*>
            (pLVar1,"Prepare tests in library: %s (%s)",pcVar5,pcVar6);
  std::__cxx11::string::~string((string *)&local_30);
  peVar4 = std::__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::IDynLibrary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->library);
  iVar3 = (*peVar4->_vptr_IDynLibrary[5])();
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(extraout_var_00,iVar3));
  x.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(extraout_var_00,iVar3));
  while (bVar2 = __gnu_cxx::
                 operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&x.field_2 + 8)), ((bVar2 ^ 0xffU) & 1) != 0) {
    __str = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator*(&__end1);
    symbol = &func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::__cxx11::string::string((string *)symbol,__str);
    CreateTestFunc((TestRunner *)local_88,(string *)symbol);
    bVar2 = std::operator==((shared_ptr<trun::TestFunc> *)local_88,(nullptr_t)0x0);
    if (!bVar2) {
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      this_00 = (shared_ptr<trun::IDynLibrary> *)((long)&moduleName.field_2 + 8);
      std::shared_ptr<trun::IDynLibrary>::shared_ptr(this_00,&this->library);
      TestFunc::SetLibrary(peVar7,this_00);
      std::shared_ptr<trun::IDynLibrary>::~shared_ptr
                ((shared_ptr<trun::IDynLibrary> *)((long)&moduleName.field_2 + 8));
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      psVar8 = TestFunc::ModuleName_abi_cxx11_(peVar7);
      std::__cxx11::string::string
                ((string *)
                 &tModule.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,psVar8);
      pLVar1 = this->pLogger;
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      psVar8 = TestFunc::ModuleName_abi_cxx11_(peVar7);
      pcVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar8);
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      psVar8 = TestFunc::CaseName_abi_cxx11_(peVar7);
      pcVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               c_str(psVar8);
      arguments_3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      gnilk::Log::Info<char_const*,char_const*,char_const*,char_const*>
                (pLVar1,"  Module: %s, case: %s, Symbol: %s",pcVar5,pcVar6,arguments_3);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &tModule.
                               super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount,"-");
      if (bVar2) {
        peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_88);
        psVar8 = TestFunc::CaseName_abi_cxx11_(peVar7);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &tModule.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,psVar8);
      }
      peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_88);
      bVar2 = TestFunc::IsGlobalMain(peVar7);
      if (bVar2) {
        peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_88);
        TestFunc::SetTestScope(peVar7,kGlobal);
        std::shared_ptr<trun::TestFunc>::operator=
                  (&this->globalMain,(shared_ptr<trun::TestFunc> *)local_88);
      }
      else {
        peVar7 = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_88);
        bVar2 = TestFunc::IsGlobalExit(peVar7);
        if (bVar2) {
          peVar7 = std::
                   __shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_88);
          TestFunc::SetTestScope(peVar7,kGlobal);
          std::shared_ptr<trun::TestFunc>::operator=
                    (&this->globalExit,(shared_ptr<trun::TestFunc> *)local_88);
        }
        else {
          GetOrAddModule((TestRunner *)local_d0,(string *)this);
          peVar7 = std::
                   __shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_88);
          bVar2 = TestFunc::IsGlobal(peVar7);
          if (bVar2) {
            peVar7 = std::
                     __shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_88);
            TestFunc::SetTestScope(peVar7,kModuleMain);
            peVar9 = std::
                     __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_d0);
            std::shared_ptr<trun::TestFunc>::operator=
                      (&peVar9->mainFunc,(shared_ptr<trun::TestFunc> *)local_88);
          }
          else {
            peVar7 = std::
                     __shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                     operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_88);
            bVar2 = TestFunc::IsModuleExit(peVar7);
            if (bVar2) {
              peVar7 = std::
                       __shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_88);
              TestFunc::SetTestScope(peVar7,kModuleExit);
              peVar9 = std::
                       __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_d0);
              std::shared_ptr<trun::TestFunc>::operator=
                        (&peVar9->exitFunc,(shared_ptr<trun::TestFunc> *)local_88);
            }
            else {
              GetOrAddModule((TestRunner *)local_e0,(string *)this);
              std::shared_ptr<trun::TestModule>::operator=
                        ((shared_ptr<trun::TestModule> *)local_d0,
                         (shared_ptr<trun::TestModule> *)local_e0);
              std::shared_ptr<trun::TestModule>::~shared_ptr
                        ((shared_ptr<trun::TestModule> *)local_e0);
              peVar7 = std::
                       __shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_88);
              TestFunc::SetTestScope(peVar7,kModuleCase);
              peVar9 = std::
                       __shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<trun::TestModule,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_d0);
              TestModule::AddTestFunc(peVar9,(Ref *)local_88);
            }
          }
          std::shared_ptr<trun::TestModule>::~shared_ptr((shared_ptr<trun::TestModule> *)local_d0);
        }
      }
      std::__cxx11::string::~string
                ((string *)
                 &tModule.super___shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::shared_ptr<trun::TestFunc>::~shared_ptr((shared_ptr<trun::TestFunc> *)local_88);
    std::__cxx11::string::~string
              ((string *)
               &func.super___shared_ptr<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void TestRunner::PrepareTests() {

    pLogger->Info("Prepare tests in library: %s (%s)", library->Name().c_str(), library->GetVersion().AsString().c_str());
    for(auto x:library->Exports()) {

        TestFunc::Ref func = CreateTestFunc(x);
        if (func == nullptr) {
            continue;
        }

        func->SetLibrary(library);

        std::string moduleName = func->ModuleName();
        pLogger->Info("  Module: %s, case: %s, Symbol: %s", func->ModuleName().c_str(), func->CaseName().c_str(), x.c_str());

        // Ok, this is the signature of the main function for a 'library' (group of functions)
        if (moduleName == "-") {
            moduleName = func->CaseName();
        }

        // Identify the symbol/pattern and assign it properly
        // The 'TestScope' is a simplification for later
        if (func->IsGlobalMain()) {
            func->SetTestScope(TestFunc::kTestScope::kGlobal);
            globalMain = func;
        } else if (func->IsGlobalExit()) {
            func->SetTestScope(TestFunc::kTestScope::kGlobal);
            globalExit = func;
        } else {
            // These are module functions - and handled differently and with lower priority
            // Note: the 'GetOrAdd' module will create a module if not found...
            auto tModule = GetOrAddModule(moduleName);
            if (func->IsGlobal()) {
                func->SetTestScope(TestFunc::kTestScope::kModuleMain);
                tModule->mainFunc = func;
            } else if (func->IsModuleExit()) {
                func->SetTestScope(TestFunc::kTestScope::kModuleExit);
                tModule->exitFunc = func;
            } else {
                tModule = GetOrAddModule(moduleName);
                func->SetTestScope(TestFunc::kTestScope::kModuleCase);
                tModule->AddTestFunc(func);
            }
        }
    }
    // Note: We can't resolve dependencies here as they are configured during module main
}